

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::LazyDescriptor::SetLazy
          (LazyDescriptor *this,string *name,FileDescriptor *file)

{
  LogMessage *pLVar1;
  long lVar2;
  string *psVar3;
  once_flag *poVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (this->descriptor_ != (Descriptor *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1c61);
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: !descriptor_: ");
    LogFinisher::operator=(&local_59,pLVar1);
    LogMessage::~LogMessage(&local_58);
  }
  if (this->file_ != (FileDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1c62);
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: !file_: ");
    LogFinisher::operator=(&local_59,pLVar1);
    LogMessage::~LogMessage(&local_58);
  }
  if (this->name_ != (string *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1c63);
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: !name_: ");
    LogFinisher::operator=(&local_59,pLVar1);
    LogMessage::~LogMessage(&local_58);
  }
  if (this->once_ != (once_flag *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1c64);
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: !once_: ");
    LogFinisher::operator=(&local_59,pLVar1);
    LogMessage::~LogMessage(&local_58);
  }
  if ((file == (FileDescriptor *)0x0) || (lVar2 = *(long *)(file + 0x10), lVar2 == 0)) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1c65);
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: file && file->pool_: ");
    LogFinisher::operator=(&local_59,pLVar1);
    LogMessage::~LogMessage(&local_58);
    lVar2 = *(long *)(file + 0x10);
  }
  if (*(char *)(lVar2 + 0x29) == '\0') {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1c66);
    pLVar1 = LogMessage::operator<<
                       (&local_58,"CHECK failed: file->pool_->lazily_build_dependencies_: ");
    LogFinisher::operator=(&local_59,pLVar1);
    LogMessage::~LogMessage(&local_58);
  }
  if (file[0x41] == (FileDescriptor)0x1) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1c67);
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: !file->finished_building_: ");
    LogFinisher::operator=(&local_59,pLVar1);
    LogMessage::~LogMessage(&local_58);
  }
  this->file_ = file;
  psVar3 = DescriptorPool::Tables::AllocateString(*(Tables **)(*(long *)(file + 0x10) + 0x20),name);
  this->name_ = psVar3;
  poVar4 = DescriptorPool::Tables::AllocateOnceDynamic(*(Tables **)(*(long *)(file + 0x10) + 0x20));
  this->once_ = poVar4;
  return;
}

Assistant:

void LazyDescriptor::SetLazy(const std::string& name,
                             const FileDescriptor* file) {
  // verify Init() has been called and Set hasn't been called yet.
  GOOGLE_CHECK(!descriptor_);
  GOOGLE_CHECK(!file_);
  GOOGLE_CHECK(!name_);
  GOOGLE_CHECK(!once_);
  GOOGLE_CHECK(file && file->pool_);
  GOOGLE_CHECK(file->pool_->lazily_build_dependencies_);
  GOOGLE_CHECK(!file->finished_building_);
  file_ = file;
  name_ = file->pool_->tables_->AllocateString(name);
  once_ = file->pool_->tables_->AllocateOnceDynamic();
}